

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

ggml_tensor * __thiscall
llm_build_rwkv7_base::build_rwkv7_time_mix
          (llm_build_rwkv7_base *this,ggml_cgraph *gf,ggml_tensor *cur,ggml_tensor *x_prev,
          ggml_tensor *state_copy,ggml_tensor *state_mask,ggml_tensor **first_layer_value,
          llama_ubatch *ubatch,int il)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t n_seqs;
  uint uVar3;
  uint uVar4;
  int iVar5;
  llama_memory_i *plVar6;
  llama_hparams *plVar7;
  pointer plVar8;
  ggml_context *pgVar9;
  ggml_context *pgVar10;
  ggml_tensor *pgVar11;
  _func_int *p_Var12;
  uint uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  ggml_tensor *pgVar19;
  ggml_tensor *pgVar20;
  ggml_tensor *pgVar21;
  ggml_tensor *pgVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  long lVar28;
  ulong uVar29;
  bool bVar30;
  uint uVar31;
  bool bVar32;
  bool bVar33;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_80;
  
  lVar28 = (long)il;
  plVar6 = (this->super_llm_graph_context).memory;
  uVar1 = ubatch->n_tokens;
  uVar2 = ubatch->n_seq_tokens;
  n_seqs = ubatch->n_seqs;
  plVar7 = (this->super_llm_graph_context).hparams;
  uVar3 = plVar7->n_embd;
  uVar29 = (ulong)uVar3;
  uVar4 = plVar7->wkv_head_size;
  uVar13 = uVar3 / uVar4;
  plVar8 = (this->model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_98 = 0;
  bVar32 = plVar8[lVar28].time_mix_g1 != (ggml_tensor *)0x0;
  bVar33 = plVar8[lVar28].time_mix_g2 != (ggml_tensor *)0x0;
  bVar30 = bVar33 && bVar32;
  iVar5 = *(int *)&plVar6[0xd]._vptr_llama_memory_i;
  uVar16 = ggml_sub((this->super_llm_graph_context).ctx0,x_prev,cur);
  uVar17 = ggml_new_tensor_4d((this->super_llm_graph_context).ctx0,0,uVar29,uVar2,n_seqs,
                              bVar30 + '\x05');
  uVar16 = ggml_repeat((this->super_llm_graph_context).ctx0,uVar16,uVar17);
  pgVar9 = (this->super_llm_graph_context).ctx0;
  uVar16 = ggml_mul(pgVar9,uVar16,plVar8[lVar28].time_mix_lerp_fused);
  lVar18 = ggml_add(pgVar9,uVar16,cur);
  pgVar19 = (ggml_tensor *)
            ggml_view_2d((this->super_llm_graph_context).ctx0,lVar18,uVar29,uVar1,
                         *(undefined8 *)(lVar18 + 0x38),0);
  uVar31 = uVar1 * uVar3;
  uVar16 = ggml_view_2d((this->super_llm_graph_context).ctx0,lVar18,uVar29,uVar1,
                        *(undefined8 *)(lVar18 + 0x38));
  pgVar20 = (ggml_tensor *)
            ggml_view_2d((this->super_llm_graph_context).ctx0,lVar18,uVar29,uVar1,
                         *(undefined8 *)(lVar18 + 0x38),(ulong)(uVar31 * 2) << 2);
  pgVar21 = (ggml_tensor *)
            ggml_view_2d((this->super_llm_graph_context).ctx0,lVar18,uVar29,uVar1,
                         *(undefined8 *)(lVar18 + 0x38),(ulong)(uVar31 * 3) << 2);
  uVar17 = ggml_view_2d((this->super_llm_graph_context).ctx0,lVar18,uVar29,uVar1,
                        *(undefined8 *)(lVar18 + 0x38),(ulong)(uVar31 * 4) << 2);
  if (bVar30) {
    local_98 = ggml_view_2d((this->super_llm_graph_context).ctx0,lVar18,uVar29,uVar1,
                            *(undefined8 *)(lVar18 + 0x38),(ulong)(uVar31 * 5) << 2);
  }
  pgVar22 = llm_graph_context::build_lora_mm
                      (&this->super_llm_graph_context,plVar8[lVar28].time_mix_receptance,pgVar19);
  pgVar9 = (this->super_llm_graph_context).ctx0;
  pgVar19 = plVar8[lVar28].time_mix_w2;
  uVar16 = ggml_mul_mat(pgVar9,plVar8[lVar28].time_mix_w1,uVar16);
  uVar16 = ggml_tanh(pgVar9,uVar16);
  uVar16 = ggml_mul_mat(pgVar9,pgVar19,uVar16);
  uVar16 = ggml_add(pgVar9,uVar16,plVar8[lVar28].time_mix_w0);
  pgVar9 = (this->super_llm_graph_context).ctx0;
  uVar16 = ggml_sigmoid(pgVar9,uVar16);
  uVar16 = ggml_scale(0xbf1b459e,pgVar9,uVar16);
  uVar16 = ggml_exp(pgVar9,uVar16);
  pgVar19 = llm_graph_context::build_lora_mm
                      (&this->super_llm_graph_context,plVar8[lVar28].time_mix_key,pgVar20);
  pgVar20 = llm_graph_context::build_lora_mm
                      (&this->super_llm_graph_context,plVar8[lVar28].time_mix_value,pgVar21);
  if (*first_layer_value == (ggml_tensor *)0x0) {
    *first_layer_value = pgVar20;
  }
  else {
    pgVar9 = (this->super_llm_graph_context).ctx0;
    uVar23 = ggml_sub(pgVar9,*first_layer_value,pgVar20);
    pgVar10 = (this->super_llm_graph_context).ctx0;
    pgVar11 = plVar8[lVar28].time_mix_v2;
    uVar24 = ggml_mul_mat(pgVar10,plVar8[lVar28].time_mix_v1,pgVar21);
    uVar24 = ggml_mul_mat(pgVar10,pgVar11,uVar24);
    uVar24 = ggml_add(pgVar10,uVar24,plVar8[lVar28].time_mix_v0);
    uVar24 = ggml_sigmoid(pgVar10,uVar24);
    uVar23 = ggml_mul(pgVar9,uVar23,uVar24);
    pgVar20 = (ggml_tensor *)ggml_add(pgVar9,pgVar20,uVar23);
  }
  if ((plVar8[lVar28].time_mix_g1 == (ggml_tensor *)0x0) ||
     (pgVar21 = plVar8[lVar28].time_mix_g2, pgVar21 == (ggml_tensor *)0x0)) {
    local_80 = 0;
  }
  else {
    pgVar9 = (this->super_llm_graph_context).ctx0;
    uVar23 = ggml_mul_mat(pgVar9,plVar8[lVar28].time_mix_g1,local_98);
    uVar23 = ggml_sigmoid(pgVar9,uVar23);
    local_80 = ggml_mul_mat(pgVar9,pgVar21,uVar23);
  }
  pgVar9 = (this->super_llm_graph_context).ctx0;
  pgVar21 = plVar8[lVar28].time_mix_a2;
  uVar17 = ggml_mul_mat(pgVar9,plVar8[lVar28].time_mix_a1,uVar17);
  uVar17 = ggml_mul_mat(pgVar9,pgVar21,uVar17);
  uVar17 = ggml_add(pgVar9,uVar17,plVar8[lVar28].time_mix_a0);
  uVar17 = ggml_sigmoid(pgVar9,uVar17);
  pgVar9 = (this->super_llm_graph_context).ctx0;
  uVar23 = ggml_mul(pgVar9,pgVar19,plVar8[lVar28].time_mix_k_k);
  uVar23 = ggml_reshape_3d(pgVar9,uVar23,uVar4,uVar13,uVar1);
  uVar23 = ggml_l2_norm(0x2b8cbccc,(this->super_llm_graph_context).ctx0,uVar23);
  uVar24 = ggml_mul((this->super_llm_graph_context).ctx0,pgVar19,plVar8[lVar28].time_mix_k_a);
  pgVar9 = (this->super_llm_graph_context).ctx0;
  uVar25 = ggml_mul(pgVar9,uVar17,uVar24);
  uVar24 = ggml_sub(pgVar9,uVar25,uVar24);
  uVar24 = ggml_add(pgVar9,pgVar19,uVar24);
  uVar25 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar22,uVar4,uVar13,uVar1);
  uVar16 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar16,uVar4,uVar13,uVar1);
  uVar24 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar24,uVar4,uVar13,uVar1);
  uVar26 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar20,uVar4,uVar13,uVar1);
  uVar17 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar17,uVar4,uVar13,uVar1);
  pgVar19 = (ggml_tensor *)plVar6[0x15]._vptr_llama_memory_i[lVar28];
  uVar14 = llama_hparams::n_embd_v_s((this->super_llm_graph_context).hparams);
  pgVar19 = llm_graph_context::build_copy_mask_state
                      (&this->super_llm_graph_context,gf,pgVar19,state_copy,state_mask,uVar14,n_seqs
                      );
  pgVar9 = (this->super_llm_graph_context).ctx0;
  uVar27 = ggml_neg(pgVar9,uVar23);
  uVar17 = ggml_mul((this->super_llm_graph_context).ctx0,uVar23,uVar17);
  uVar16 = ggml_rwkv_wkv7(pgVar9,uVar25,uVar16,uVar24,uVar26,uVar27,uVar17,pgVar19);
  uVar17 = ggml_view_1d((this->super_llm_graph_context).ctx0,uVar16,(ulong)uVar31,0);
  uVar16 = ggml_view_1d((this->super_llm_graph_context).ctx0,uVar16,uVar3 * n_seqs * uVar4,
                        (ulong)uVar31 * 4);
  pgVar9 = (this->super_llm_graph_context).ctx0;
  p_Var12 = plVar6[0x15]._vptr_llama_memory_i[lVar28];
  uVar14 = llama_hparams::n_embd_v_s((this->super_llm_graph_context).hparams);
  uVar15 = llama_hparams::n_embd_v_s((this->super_llm_graph_context).hparams);
  lVar18 = ggml_element_size(plVar6[0x15]._vptr_llama_memory_i[lVar28]);
  uVar23 = ggml_view_1d(pgVar9,p_Var12,n_seqs * uVar14,(ulong)(iVar5 * uVar15) * lVar18);
  uVar16 = ggml_cpy(pgVar9,uVar16,uVar23);
  ggml_build_forward_expand(gf,uVar16);
  if ((plVar8[lVar28].time_mix_ln == (ggml_tensor *)0x0) ||
     (plVar8[lVar28].time_mix_ln_b == (ggml_tensor *)0x0)) {
    local_a8 = ggml_reshape_2d((this->super_llm_graph_context).ctx0,uVar17,uVar29,uVar1);
  }
  else {
    uVar16 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar17,uVar29 / uVar13,uVar13,
                             uVar1);
    uVar16 = ggml_norm(0x3a27c5ac,(this->super_llm_graph_context).ctx0,uVar16);
    uVar16 = ggml_reshape_2d((this->super_llm_graph_context).ctx0,uVar16,uVar29,uVar1);
    pgVar9 = (this->super_llm_graph_context).ctx0;
    uVar16 = ggml_mul(pgVar9,uVar16,plVar8[lVar28].time_mix_ln);
    local_a8 = ggml_add(pgVar9,uVar16,plVar8[lVar28].time_mix_ln_b);
  }
  pgVar9 = (this->super_llm_graph_context).ctx0;
  uVar16 = ggml_mul(pgVar9,uVar24,uVar25);
  uVar17 = ggml_reshape_2d((this->super_llm_graph_context).ctx0,plVar8[lVar28].time_mix_r_k,uVar4,
                           uVar13);
  uVar16 = ggml_mul(pgVar9,uVar16,uVar17);
  uVar16 = ggml_sum_rows(pgVar9,uVar16);
  pgVar9 = (this->super_llm_graph_context).ctx0;
  uVar16 = ggml_mul(pgVar9,uVar26,uVar16);
  uVar16 = ggml_reshape_2d(pgVar9,uVar16,uVar29,uVar1);
  pgVar19 = (ggml_tensor *)ggml_add(pgVar9,local_a8,uVar16);
  if (bVar33 && bVar32) {
    pgVar19 = (ggml_tensor *)ggml_mul((this->super_llm_graph_context).ctx0,pgVar19,local_80);
  }
  pgVar19 = llm_graph_context::build_lora_mm
                      (&this->super_llm_graph_context,plVar8[lVar28].time_mix_output,pgVar19);
  pgVar19 = (ggml_tensor *)
            ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar19,uVar29,uVar2,n_seqs);
  return pgVar19;
}

Assistant:

ggml_tensor * build_rwkv7_time_mix(
            ggml_cgraph * gf,
            ggml_tensor * cur,
            ggml_tensor * x_prev,
            ggml_tensor * state_copy,
            ggml_tensor * state_mask,
            ggml_tensor *& first_layer_value,
            const llama_ubatch & ubatch,
            int   il) const {
        const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

        const auto n_tokens = ubatch.n_tokens;
        const auto n_seqs = ubatch.n_seqs;
        const auto n_embd = hparams.n_embd;
        const auto head_size = hparams.wkv_head_size;
        const auto head_count = n_embd / head_size;
        const auto n_seq_tokens = ubatch.n_seq_tokens;

        const auto kv_head = kv_self->head;

        const auto & layer = model.layers[il];

        bool has_gating = layer.time_mix_g1 && layer.time_mix_g2;

        ggml_tensor * sx = ggml_sub(ctx0, x_prev, cur);
        ggml_tensor * dummy = ggml_new_tensor_4d(ctx0, GGML_TYPE_F32, n_embd, n_seq_tokens, n_seqs, has_gating ? 6 : 5);
        sx = ggml_repeat(ctx0, sx, dummy);

        ggml_tensor * xxx = ggml_add(ctx0, ggml_mul(ctx0, sx, layer.time_mix_lerp_fused), cur);

        ggml_tensor * xr = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], 0);
        ggml_tensor * xw = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * sizeof(float));
        ggml_tensor * xk = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 2 * sizeof(float));
        ggml_tensor * xv = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 3 * sizeof(float));
        ggml_tensor * xa = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 4 * sizeof(float));
        ggml_tensor * xg = has_gating ? ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 5 * sizeof(float)) : nullptr;

        ggml_tensor * r = build_lora_mm(layer.time_mix_receptance, xr);
        ggml_tensor * w = ggml_add(
            ctx0,
            ggml_mul_mat(ctx0, layer.time_mix_w2, ggml_tanh(ctx0, ggml_mul_mat(ctx0, layer.time_mix_w1, xw))),
            layer.time_mix_w0
        );
        w = ggml_exp(ctx0, ggml_scale(ctx0, ggml_sigmoid(ctx0, w), -0.606531));

        ggml_tensor * k = build_lora_mm(layer.time_mix_key, xk);
        ggml_tensor * v = build_lora_mm(layer.time_mix_value, xv);
        if (first_layer_value == nullptr) {
            first_layer_value = v;
        } else {
            // Add the first layer value as a residual connection.
            v = ggml_add(ctx0, v,
                ggml_mul(ctx0,
                    ggml_sub(ctx0, first_layer_value, v),
                    ggml_sigmoid(ctx0, ggml_add(ctx0,
                            ggml_mul_mat(ctx0, layer.time_mix_v2, ggml_mul_mat(ctx0, layer.time_mix_v1, xv)),
                            layer.time_mix_v0
                        )
                    )
                )
            );
        }

        ggml_tensor * g = nullptr;
        if (layer.time_mix_g1 && layer.time_mix_g2) {
            g = ggml_mul_mat(ctx0, layer.time_mix_g2, ggml_sigmoid(ctx0, ggml_mul_mat(ctx0, layer.time_mix_g1, xg)));
        }

        ggml_tensor * a = ggml_sigmoid(ctx0,
            ggml_add(
                ctx0,
                ggml_mul_mat(ctx0, layer.time_mix_a2, ggml_mul_mat(ctx0, layer.time_mix_a1, xa)),
                layer.time_mix_a0
            )
        );

        ggml_tensor * kk = ggml_reshape_3d(ctx0, ggml_mul(ctx0, k, layer.time_mix_k_k), head_size, head_count, n_tokens);
        kk = ggml_l2_norm(ctx0, kk, 1e-12);

        ggml_tensor * ka = ggml_mul(ctx0, k, layer.time_mix_k_a);
        k = ggml_add(ctx0, k, ggml_sub(ctx0, ggml_mul(ctx0, a, ka), ka));

        r = ggml_reshape_3d(ctx0, r, head_size, head_count, n_tokens);
        w = ggml_reshape_3d(ctx0, w, head_size, head_count, n_tokens);
        k = ggml_reshape_3d(ctx0, k, head_size, head_count, n_tokens);
        v = ggml_reshape_3d(ctx0, v, head_size, head_count, n_tokens);
        a = ggml_reshape_3d(ctx0, a, head_size, head_count, n_tokens);

        ggml_tensor * wkv_state = build_copy_mask_state(
                gf, kv_self->v_l[il], state_copy, state_mask,
                hparams.n_embd_v_s(), n_seqs);

        ggml_tensor * wkv_output = ggml_rwkv_wkv7(ctx0, r, w, k, v, ggml_neg(ctx0, kk), ggml_mul(ctx0, kk, a), wkv_state);
        cur = ggml_view_1d(ctx0, wkv_output, n_embd * n_tokens, 0);
        wkv_state = ggml_view_1d(ctx0, wkv_output, n_embd * head_size * n_seqs, n_embd * n_tokens * sizeof(float));

        ggml_build_forward_expand(
                gf,
                ggml_cpy(
                    ctx0,
                    wkv_state,
                    ggml_view_1d(
                        ctx0,
                        kv_self->v_l[il],
                        hparams.n_embd_v_s() * n_seqs,
                        hparams.n_embd_v_s() * kv_head * ggml_element_size(kv_self->v_l[il])
                        )
                    )
                );

        if (layer.time_mix_ln && layer.time_mix_ln_b) {
            // group norm with head_count groups
            cur = ggml_reshape_3d(ctx0, cur, n_embd / head_count, head_count, n_tokens);
            cur = ggml_norm(ctx0, cur, 64e-5f);

            // Convert back to regular vectors.
            cur = ggml_reshape_2d(ctx0, cur, n_embd, n_tokens);
            cur = ggml_add(ctx0, ggml_mul(ctx0, cur, layer.time_mix_ln), layer.time_mix_ln_b);
        } else {
            cur = ggml_reshape_2d(ctx0, cur, n_embd, n_tokens);
        }

        ggml_tensor * rk = ggml_sum_rows(ctx0,
                ggml_mul(ctx0, ggml_mul(ctx0, k, r), ggml_reshape_2d(ctx0, layer.time_mix_r_k, head_size, head_count)));
        cur = ggml_add(ctx0, cur, ggml_reshape_2d(ctx0, ggml_mul(ctx0, v, rk), n_embd, n_tokens));

        if (has_gating) {
            cur = ggml_mul(ctx0, cur, g);
        }
        cur = build_lora_mm(layer.time_mix_output, cur);

        return ggml_reshape_3d(ctx0, cur, n_embd, n_seq_tokens, n_seqs);
    }